

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O2

int SUNLinSolFree_SPTFQMR(SUNLinearSolver S)

{
  void *__ptr;
  
  if (S != (SUNLinearSolver)0x0) {
    __ptr = S->content;
    if (*(N_Vector *)((long)__ptr + 0x58) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)__ptr + 0x58));
      __ptr = S->content;
    }
    if (*(N_Vector *)((long)__ptr + 0x60) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)__ptr + 0x60));
      __ptr = S->content;
    }
    if (*(N_Vector *)((long)__ptr + 0x68) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)__ptr + 0x68));
      __ptr = S->content;
    }
    if (*(N_Vector *)((long)__ptr + 0x70) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)__ptr + 0x70));
      __ptr = S->content;
    }
    if (*(N_Vector *)((long)__ptr + 0x78) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)__ptr + 0x78));
      __ptr = S->content;
    }
    if (*(N_Vector **)((long)__ptr + 0x80) != (N_Vector *)0x0) {
      N_VDestroyVectorArray(*(N_Vector **)((long)__ptr + 0x80),2);
      __ptr = S->content;
    }
    if (*(N_Vector *)((long)__ptr + 0x88) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)__ptr + 0x88));
      __ptr = S->content;
    }
    if (*(N_Vector *)((long)__ptr + 0x90) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)__ptr + 0x90));
      __ptr = S->content;
    }
    if (*(N_Vector *)((long)__ptr + 0x98) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)__ptr + 0x98));
      __ptr = S->content;
    }
    if (*(N_Vector *)((long)__ptr + 0xa0) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)((long)__ptr + 0xa0));
      __ptr = S->content;
    }
    free(__ptr);
    S->content = (void *)0x0;
    free(S->ops);
    free(S);
  }
  return 0;
}

Assistant:

int SUNLinSolFree_SPTFQMR(SUNLinearSolver S)
{
  if (S == NULL) return(SUNLS_SUCCESS);

  /* delete items from within the content structure */
  if (SPTFQMR_CONTENT(S)->r_star)
    N_VDestroy(SPTFQMR_CONTENT(S)->r_star);
  if (SPTFQMR_CONTENT(S)->q)
    N_VDestroy(SPTFQMR_CONTENT(S)->q);
  if (SPTFQMR_CONTENT(S)->d)
    N_VDestroy(SPTFQMR_CONTENT(S)->d);
  if (SPTFQMR_CONTENT(S)->v)
    N_VDestroy(SPTFQMR_CONTENT(S)->v);
  if (SPTFQMR_CONTENT(S)->p)
    N_VDestroy(SPTFQMR_CONTENT(S)->p);
  if (SPTFQMR_CONTENT(S)->r)
    N_VDestroyVectorArray(SPTFQMR_CONTENT(S)->r, 2);
  if (SPTFQMR_CONTENT(S)->u)
    N_VDestroy(SPTFQMR_CONTENT(S)->u);
  if (SPTFQMR_CONTENT(S)->vtemp1)
    N_VDestroy(SPTFQMR_CONTENT(S)->vtemp1);
  if (SPTFQMR_CONTENT(S)->vtemp2)
    N_VDestroy(SPTFQMR_CONTENT(S)->vtemp2);
  if (SPTFQMR_CONTENT(S)->vtemp3)
    N_VDestroy(SPTFQMR_CONTENT(S)->vtemp3);

  /* delete generic structures */
  free(S->content);  S->content = NULL;
  free(S->ops);  S->ops = NULL;
  free(S); S = NULL;
  return(SUNLS_SUCCESS);
}